

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoop.cpp
# Opt level: O2

void __thiscall
sznet::net::KcpTcpEventLoop::removeTcpConnectionInLoop
          (KcpTcpEventLoop *this,TcpConnectionPtr *tcpConn)

{
  key_type *__x;
  uint __line;
  self *psVar1;
  iterator iVar2;
  iterator iVar3;
  LogStream *this_00;
  KcpConnectionPtr *this_01;
  char *__assertion;
  SourceFile file;
  SourceFile file_00;
  undefined1 local_10a8 [24];
  KcpConnectionPtr local_1090 [251];
  undefined1 local_d8 [12];
  undefined1 local_c8 [12];
  Functor local_b8;
  Functor local_98;
  code *local_78;
  undefined8 local_70;
  Functor local_68;
  undefined1 local_48 [8];
  KcpConnectionPtr kcpConn;
  uint32_t conv;
  
  if (g_logLevel < 3) {
    Logger::SourceFile::SourceFile<106>
              ((SourceFile *)local_d8,
               (char (*) [106])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_d8._0_8_;
    file.m_size = local_d8._8_4_;
    Logger::Logger((Logger *)local_10a8,file,0x28);
    psVar1 = LogStream::operator<<
                       ((LogStream *)(local_10a8 + 8),"KcpTcpEventLoop::removeConnectionInLoop [");
    psVar1 = LogStream::operator<<(psVar1,&this->m_name);
    psVar1 = LogStream::operator<<(psVar1,"] - connection ");
    psVar1 = LogStream::operator<<
                       (psVar1,&((tcpConn->
                                 super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->m_name);
    psVar1 = LogStream::operator<<(psVar1," - ");
    LogStream::operator<<
              (psVar1,((tcpConn->
                       super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->m_id);
    Logger::~Logger((Logger *)local_10a8);
  }
  EventLoop::assertInLoopThread(&this->super_EventLoop);
  kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = ((tcpConn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->m_id;
  iVar2 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
          ::find(&(this->m_tcpConnections)._M_t,
                 (key_type *)
                 ((long)&kcpConn.
                         super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 4));
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->m_tcpConnections)._M_t._M_impl.super__Rb_tree_header) {
    __assertion = "fTcpIter != m_tcpConnections.end()";
    __line = 0x2e;
  }
  else {
    if ((element_type *)iVar2._M_node[1]._M_parent ==
        (tcpConn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    {
      __x = (key_type *)
            ((long)&kcpConn.
                    super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 4);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
      ::erase(&(this->m_tcpConnections)._M_t,__x);
      iVar3 = std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>_>_>
              ::find(&(this->m_kcpConnections)._M_t,__x);
      if ((_Rb_tree_header *)iVar3._M_node ==
          &(this->m_kcpConnections)._M_t._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
        ::erase(&(this->m_crypts)._M_t,
                (key_type *)
                ((long)&kcpConn.
                        super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4));
        assertVessels(this);
        local_48 = (undefined1  [8])TcpConnection::connectDestroyed;
        kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>
        ::_Bind<std::shared_ptr<sznet::net::TcpConnection>const&>
                  ((_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>
                    *)local_10a8,(offset_in_TcpConnection_to_subr *)local_48,tcpConn);
        std::function<void()>::
        function<std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>,void>
                  ((function<void()> *)&local_b8,
                   (_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>
                    *)local_10a8);
        EventLoop::queueInLoop(&this->super_EventLoop,&local_b8);
        std::_Function_base::~_Function_base(&local_b8.super__Function_base);
        this_01 = (KcpConnectionPtr *)(local_10a8 + 0x18);
      }
      else {
        std::__shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2> *)local_48,
                   (__shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2> *)
                   &iVar3._M_node[1]._M_parent);
        if (g_logLevel < 3) {
          Logger::SourceFile::SourceFile<106>
                    ((SourceFile *)local_c8,
                     (char (*) [106])
                     "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                    );
          file_00._12_4_ = 0;
          file_00.m_data = (char *)local_c8._0_8_;
          file_00.m_size = local_c8._8_4_;
          Logger::Logger((Logger *)local_10a8,file_00,0x3e);
          psVar1 = LogStream::operator<<
                             ((LogStream *)(local_10a8 + 8),
                              "KcpTcpEventLoop::removeConnectionInLoop [");
          psVar1 = LogStream::operator<<(psVar1,&this->m_name);
          psVar1 = LogStream::operator<<(psVar1,"] - connection ");
          psVar1 = LogStream::operator<<(psVar1,(string *)((long)local_48 + 0x20));
          psVar1 = LogStream::operator<<(psVar1," - ");
          this_00 = LogStream::operator<<(psVar1,*(uint32_t *)((long)local_48 + 0x40));
          psVar1 = LogStream::operator<<(this_00,"- ");
          LogStream::operator<<(psVar1,*(StateE *)((long)local_48 + 0x44) == kConnected);
          Logger::~Logger((Logger *)local_10a8);
        }
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
        ::erase(&(this->m_crypts)._M_t,
                (key_type *)
                ((long)&kcpConn.
                        super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4));
        KcpConnection::peerAddress((InetAddress *)local_10a8,(KcpConnection *)local_48);
        std::
        _Hashtable<sockaddr_in,_std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>,_std::allocator<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>_>,_std::__detail::_Select1st,_sznet::net::KcpTcpEventLoop::sockaddrInKeyEqual,_sznet::net::KcpTcpEventLoop::sockaddrInKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_erase(&(this->m_addrConns)._M_h,local_10a8);
        local_78 = TcpConnection::connectDestroyed;
        local_70 = 0;
        std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>
        ::_Bind<std::shared_ptr<sznet::net::TcpConnection>const&>
                  ((_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>
                    *)local_10a8,(offset_in_TcpConnection_to_subr *)&local_78,tcpConn);
        std::function<void()>::
        function<std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>,void>
                  ((function<void()> *)&local_98,
                   (_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>
                    *)local_10a8);
        EventLoop::queueInLoop(&this->super_EventLoop,&local_98);
        std::_Function_base::~_Function_base(&local_98.super__Function_base);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_10a8 + 0x18));
        local_78 = KcpConnection::forceCloseInLoop;
        local_70 = 0;
        std::_Bind<void(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>))()>
        ::_Bind<std::shared_ptr<sznet::net::KcpConnection>&>
                  ((_Bind<void(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>))()>
                    *)local_10a8,(offset_in_KcpConnection_to_subr *)&local_78,
                   (shared_ptr<sznet::net::KcpConnection> *)local_48);
        std::function<void()>::
        function<std::_Bind<void(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>))()>,void>
                  ((function<void()> *)&local_68,
                   (_Bind<void_(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>))()>
                    *)local_10a8);
        EventLoop::runInLoop(&this->super_EventLoop,&local_68);
        std::_Function_base::~_Function_base(&local_68.super__Function_base);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_10a8 + 0x18));
        this_01 = &kcpConn;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_01);
      return;
    }
    __assertion = "fTcpIter->second.get() == tcpConn.get()";
    __line = 0x2f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                ,__line,
                "void sznet::net::KcpTcpEventLoop::removeTcpConnectionInLoop(const TcpConnectionPtr &)"
               );
}

Assistant:

void KcpTcpEventLoop::removeTcpConnectionInLoop(const TcpConnectionPtr& tcpConn)
{
	LOG_INFO << "KcpTcpEventLoop::removeConnectionInLoop [" << m_name
		<< "] - connection " << tcpConn->name() << " - " << tcpConn->id();

	assertInLoopThread();
	uint32_t conv = tcpConn->id();
	TcpConnectionMap::iterator fTcpIter = m_tcpConnections.find(conv);
	assert(fTcpIter != m_tcpConnections.end());
	assert(fTcpIter->second.get() == tcpConn.get());
	m_tcpConnections.erase(conv);
	KcpConnectionMap::iterator fKcpIter = m_kcpConnections.find(conv);
	if (fKcpIter == m_kcpConnections.end())
	{
		// 说明这个时候客户端还没有回执校验就断开了 或者 KCP主动断掉连接了
		// 有可能有，有可能没有，都删除一下
		m_crypts.erase(conv);
		assertVessels();
		queueInLoop(std::bind(&TcpConnection::connectDestroyed, tcpConn));
	}
	else
	{
		KcpConnectionPtr kcpConn = fKcpIter->second;

		LOG_INFO << "KcpTcpEventLoop::removeConnectionInLoop [" << m_name
			<< "] - connection " << kcpConn->name() << " - " << kcpConn->id() << 
			"- " << kcpConn->connected();

		// kcp conn 存在，但是也有可能没有连接成功
		m_crypts.erase(conv);
		m_addrConns.erase(*kcpConn->peerAddress().getSockAddrIn());
		// 这里不处理 m_kcpConnections
		queueInLoop(std::bind(&TcpConnection::connectDestroyed, tcpConn));
		runInLoop(std::bind(&KcpConnection::forceCloseInLoop, kcpConn));
	}
}